

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

void u_on_sstairs(void)

{
  monst *pmVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char cVar6;
  
  cVar6 = (level->sstairs).sx;
  if (cVar6 != '\0') {
    iVar5 = (int)(level->sstairs).sy;
LAB_00187d9c:
    u_on_newpos((int)cVar6,iVar5);
    return;
  }
  iVar5 = 0x1f5;
  do {
    iVar3 = rnd(0x4f);
    uVar4 = mt_random();
    uVar2 = (ulong)uVar4 % 0x15;
    cVar6 = (char)iVar3;
    if ((level->locations[cVar6][uVar2].typ & 0xfeU) == 0x18) {
      pmVar1 = level->monsters[cVar6][uVar2];
      if ((pmVar1 == (monst *)0x0) || ((pmVar1->field_0x61 & 2) != 0)) {
        iVar5 = (int)uVar2;
        goto LAB_00187d9c;
      }
    }
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      panic("u_on_sstairs: could not relocate player!");
    }
  } while( true );
}

Assistant:

void u_on_sstairs(void)
{

	if (level->sstairs.sx) {
	    u_on_newpos(level->sstairs.sx, level->sstairs.sy);
	} else {
	    /* code stolen from goto_level */
	    int trycnt = 0;
	    xchar x, y;

	    do {
		x = rnd(COLNO-1);
		y = rn2(ROWNO);
		if (!badspot(x, y)) {
		    u_on_newpos(x, y);
		    return;
		}
	    } while (++trycnt <= 500);
	    panic("u_on_sstairs: could not relocate player!");
	}
}